

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::BufferAgeTest::initEGLContext(BufferAgeTest *this,EGLConfig config)

{
  deUint32 dVar1;
  EGLContext pvVar2;
  undefined8 local_2c;
  EGLint attribList [3];
  Library *egl;
  EGLConfig config_local;
  BufferAgeTest *this_local;
  
  attribList._4_8_ = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_2c = 0x200003098;
  attribList[0] = 0x3038;
  (**((Library *)attribList._4_8_)->_vptr_Library)(attribList._4_8_,0x30a0);
  pvVar2 = (EGLContext)
           (**(code **)(*(long *)attribList._4_8_ + 0x30))
                     (attribList._4_8_,this->m_eglDisplay,config,0,&local_2c);
  this->m_eglContext = pvVar2;
  dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
  eglu::checkError(dVar1,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                   ,0x1cb);
  (**(code **)(*(long *)attribList._4_8_ + 0x138))
            (attribList._4_8_,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,
             this->m_eglContext);
  dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
  eglu::checkError(dVar1,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                   ,0x1ce);
  return;
}

Assistant:

void BufferAgeTest::initEGLContext (EGLConfig config)
{
	const Library&	egl			 = m_eglTestCtx.getLibrary();
	const EGLint	attribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	egl.bindAPI(EGL_OPENGL_ES_API);
	m_eglContext = egl.createContext(m_eglDisplay, config, EGL_NO_CONTEXT, attribList);
	EGLU_CHECK_MSG(egl, "eglCreateContext");
	DE_ASSERT(m_eglSurface != EGL_NO_SURFACE);
	egl.makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");
}